

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O3

void ibuf_shrink(ibuf *ibuf)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  slab *psVar4;
  slab *__dest;
  ulong __n;
  ulong size;
  
  if (ibuf->rpos <= ibuf->wpos) {
    pcVar1 = ibuf->buf;
    __n = (long)ibuf->wpos - (long)ibuf->rpos;
    if (__n == 0) {
      if (pcVar1 != (char *)0x0) {
        slab_put(ibuf->slabc,(slab *)(pcVar1 + -0x30));
      }
      ibuf->wpos = (char *)0x0;
      ibuf->end = (char *)0x0;
      ibuf->buf = (char *)0x0;
      ibuf->rpos = (char *)0x0;
    }
    else {
      size = ibuf->start_capacity;
      if (ibuf->start_capacity <= __n) {
        size = __n;
      }
      sVar2 = slab_real_size(ibuf->slabc,(long)ibuf->end - (long)pcVar1);
      sVar3 = slab_real_size(ibuf->slabc,size);
      if (sVar2 != sVar3) {
        psVar4 = slab_get(ibuf->slabc,size);
        if (psVar4 != (slab *)0x0) {
          __dest = psVar4 + 1;
          memcpy(__dest,ibuf->rpos,__n);
          if (ibuf->buf != (char *)0x0) {
            slab_put(ibuf->slabc,(slab *)(ibuf->buf + -0x30));
          }
          ibuf->buf = (char *)__dest;
          ibuf->rpos = (char *)__dest;
          ibuf->wpos = (char *)(__n + (long)__dest);
          ibuf->end = (char *)((long)&(psVar4->next_in_cache).prev + psVar4->size);
        }
      }
    }
    return;
  }
  __assert_fail("ibuf->wpos >= ibuf->rpos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/ibuf.h"
                ,0x56,"size_t ibuf_used(struct ibuf *)");
}

Assistant:

void
ibuf_shrink(struct ibuf *ibuf)
{
	size_t used = ibuf_used(ibuf);
	if (used == 0) {
		if (ibuf->buf)
			slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
		ibuf->buf = ibuf->rpos = ibuf->wpos = ibuf->end = NULL;
		return;
	}

	size_t capacity = ibuf_capacity(ibuf);
	size_t new_capacity = ibuf->start_capacity;
	if (new_capacity < used)
		new_capacity = used;

	/* Avoid relocation if the actual slab size doesn't change. */
	if (slab_real_size(ibuf->slabc, capacity) ==
	    slab_real_size(ibuf->slabc, new_capacity))
		return;

	struct slab *slab = slab_get(ibuf->slabc, new_capacity);
	if (slab == NULL)
		return;

	char *ptr = (char *)slab_data(slab);
	memcpy(ptr, ibuf->rpos, used);
	if (ibuf->buf)
		slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
	ibuf->buf = ptr;
	ibuf->rpos = ptr;
	ibuf->wpos = ptr + used;
	ibuf->end = ptr + slab_capacity(slab);
	ibuf_poison_unallocated(ibuf);
}